

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O2

Ivy_Supp_t * Ivy_ObjSuppStart(Ivy_Man_t *pAig,Ivy_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  Ivy_Supp_t *pIVar3;
  
  lVar2 = *(long *)((long)pAig->pData + 0x10);
  iVar1 = pObj->Id;
  pIVar3 = (Ivy_Supp_t *)((long)*(int *)((long)pAig->pData + 8) * (long)iVar1);
  *(undefined2 *)((long)&pIVar3->Delay + lVar2) = 0;
  *(undefined2 *)(&pIVar3->nSize + lVar2) = 1;
  *(int *)(&pIVar3[1].nSize + lVar2) = iVar1;
  return pIVar3;
}

Assistant:

static inline Ivy_Supp_t * Ivy_ObjSuppStart( Ivy_Man_t * pAig, Ivy_Obj_t * pObj ) 
{ 
    Ivy_Supp_t * pSupp;
    pSupp = Ivy_ObjSupp( pAig, pObj );
    pSupp->fMark = 0;
    pSupp->Delay = 0;
    pSupp->nSize = 1;
    pSupp->pArray[0] = pObj->Id;
    return pSupp;
}